

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DGXMLScanner::DGXMLScanner
          (DGXMLScanner *this,XMLValidator *valToAdopt,GrammarResolver *grammarResolver,
          MemoryManager *manager)

{
  OutOfMemoryException *anon_var_0;
  undefined1 local_40 [8];
  CleanupType_conflict12 cleanup;
  MemoryManager *manager_local;
  GrammarResolver *grammarResolver_local;
  XMLValidator *valToAdopt_local;
  DGXMLScanner *this_local;
  
  cleanup._16_8_ = manager;
  XMLScanner::XMLScanner(&this->super_XMLScanner,valToAdopt,grammarResolver,manager);
  (this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler =
       (_func_int **)&PTR__DGXMLScanner_0052f400;
  this->fAttrNSList = (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)0x0;
  this->fDTDValidator = (DTDValidator *)0x0;
  this->fDTDGrammar = (DTDGrammar *)0x0;
  this->fDTDElemNonDeclPool = (NameIdPool<xercesc_4_0::DTDElementDecl> *)0x0;
  this->fElemCount = 0;
  this->fAttDefRegistry = (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)0x0;
  this->fUndeclaredAttrRegistry = (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)0x0;
  JanitorMemFunCall<xercesc_4_0::DGXMLScanner>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::DGXMLScanner> *)local_40,this,(MFPT)cleanUp);
  commonInit(this);
  JanitorMemFunCall<xercesc_4_0::DGXMLScanner>::release
            ((JanitorMemFunCall<xercesc_4_0::DGXMLScanner> *)local_40);
  JanitorMemFunCall<xercesc_4_0::DGXMLScanner>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::DGXMLScanner> *)local_40);
  return;
}

Assistant:

DGXMLScanner::DGXMLScanner(XMLValidator* const valToAdopt
                         , GrammarResolver* const grammarResolver
                         , MemoryManager* const manager) :

    XMLScanner(valToAdopt, grammarResolver, manager)
    , fAttrNSList(0)
    , fDTDValidator(0)
    , fDTDGrammar(0)
    , fDTDElemNonDeclPool(0)
    , fElemCount(0)
    , fAttDefRegistry(0)
    , fUndeclaredAttrRegistry(0)
{
    CleanupType cleanup(this, &DGXMLScanner::cleanUp);

    try
    {
        commonInit();
    }
    catch(const OutOfMemoryException&)
    {
        // Don't cleanup when out of memory, since executing the
        // code can cause problems.
        cleanup.release();

        throw;
    }

    cleanup.release();
}